

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::UnitTestImpl::AddTestInfo
          (UnitTestImpl *this,SetUpTestCaseFunc set_up_tc,TearDownTestCaseFunc tear_down_tc,
          TestInfo *test_info)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 in_RDX;
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  undefined8 in_RDI;
  GTestLog *unaff_retaddr;
  TearDownTestCaseFunc in_stack_00000098;
  SetUpTestCaseFunc in_stack_000000a0;
  char *in_stack_000000a8;
  char *in_stack_000000b0;
  UnitTestImpl *in_stack_000000b8;
  TestInfo *in_stack_ffffffffffffff78;
  FilePath *in_stack_ffffffffffffff80;
  TestInfo *in_stack_ffffffffffffff88;
  TestCase *in_stack_ffffffffffffff90;
  undefined4 line;
  GTestLogSeverity severity;
  
  severity = (GTestLogSeverity)((ulong)in_RDI >> 0x20);
  line = (undefined4)((ulong)in_RDX >> 0x20);
  bVar1 = FilePath::IsEmpty((FilePath *)0x1960a4);
  if (bVar1) {
    FilePath::GetCurrentDir();
    FilePath::Set(in_stack_ffffffffffffff80,(FilePath *)in_stack_ffffffffffffff78);
    FilePath::~FilePath((FilePath *)0x1960e5);
    bVar1 = FilePath::IsEmpty((FilePath *)0x1960f3);
    bVar1 = IsTrue((bool)((bVar1 ^ 0xffU) & 1));
    if (!bVar1) {
      in_stack_ffffffffffffff88 = (TestInfo *)&stack0xffffffffffffffb0;
      GTestLog::GTestLog(unaff_retaddr,severity,(char *)in_RSI.ptr_,line);
      poVar2 = GTestLog::GetStream((GTestLog *)in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff90 =
           (TestCase *)std::operator<<(poVar2,"Condition !original_working_dir_.IsEmpty() failed. ")
      ;
      std::operator<<((ostream *)in_stack_ffffffffffffff90,
                      "Failed to get the current working directory.");
      GTestLog::~GTestLog((GTestLog *)in_stack_ffffffffffffff80);
    }
  }
  TestInfo::test_case_name((TestInfo *)0x1961ad);
  TestInfo::type_param(in_stack_ffffffffffffff78);
  GetTestCase(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
              in_stack_00000098);
  TestCase::AddTestInfo(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return;
}

Assistant:

void AddTestInfo(Test::SetUpTestCaseFunc set_up_tc,
                   Test::TearDownTestCaseFunc tear_down_tc,
                   TestInfo* test_info) {
    // In order to support thread-safe death tests, we need to
    // remember the original working directory when the test program
    // was first invoked.  We cannot do this in RUN_ALL_TESTS(), as
    // the user may have changed the current directory before calling
    // RUN_ALL_TESTS().  Therefore we capture the current directory in
    // AddTestInfo(), which is called to register a TEST or TEST_F
    // before main() is reached.
    if (original_working_dir_.IsEmpty()) {
      original_working_dir_.Set(FilePath::GetCurrentDir());
      GTEST_CHECK_(!original_working_dir_.IsEmpty())
          << "Failed to get the current working directory.";
    }

    GetTestCase(test_info->test_case_name(),
                test_info->type_param(),
                set_up_tc,
                tear_down_tc)->AddTestInfo(test_info);
  }